

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmComputeShaderTestUtil.hpp
# Opt level: O0

void __thiscall vkt::SpirVAssembly::ComputeShaderSpec::ComputeShaderSpec(ComputeShaderSpec *this)

{
  allocator<char> local_25 [20];
  allocator<char> local_11;
  ComputeShaderSpec *local_10;
  ComputeShaderSpec *this_local;
  
  local_10 = this;
  std::__cxx11::string::string((string *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->entryPoint,"main",&local_11);
  std::allocator<char>::~allocator(&local_11);
  std::
  vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
  ::vector(&this->inputs);
  std::
  vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
  ::vector(&this->outputs);
  tcu::Vector<int,_3>::Vector(&this->numWorkGroups);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->specConstants);
  this->failResult = QP_TEST_RESULT_FAIL;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->failMessage,"Output doesn\'t match with expected",local_25);
  std::allocator<char>::~allocator(local_25);
  this->verifyIO =
       (_func_bool_vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>_ptr_vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>_ptr_vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>_ptr_TestLog_ptr
        *)0x0;
  return;
}

Assistant:

ComputeShaderSpec (void)
								: entryPoint	("main")
								, failResult	(QP_TEST_RESULT_FAIL)
								, failMessage	("Output doesn't match with expected")
								, verifyIO		(DE_NULL)
							{}